

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configuration.cpp
# Opt level: O3

int main(void)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"stable",6);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout," version of boost.di [",0x16);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x82);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return 0;
}

Assistant:

int main() {
#if (BOOST_DI_VERSION >= 1'0'0)
  std::cout << "stable";
#else
  std::cout << "unstable";
#endif
  std::cout << " version of boost.di [" << BOOST_DI_VERSION << "]" << std::endl;
}